

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
 __thiscall anon_unknown.dwarf_29c3b1::ConstPubkeyProvider::Clone(ConstPubkeyProvider *this)

{
  byte bVar1;
  undefined4 uVar2;
  long lVar3;
  _func_int **pp_Var4;
  long lVar5;
  long in_RSI;
  undefined4 *puVar6;
  undefined4 *puVar7;
  long in_FS_OFFSET;
  byte bVar8;
  
  bVar8 = 0;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = *(undefined4 *)(in_RSI + 8);
  bVar1 = *(byte *)(in_RSI + 0x4d);
  pp_Var4 = (_func_int **)operator_new(0x50);
  *(undefined4 *)(pp_Var4 + 1) = uVar2;
  *pp_Var4 = (_func_int *)&PTR__PubkeyProvider_003d8508;
  puVar6 = (undefined4 *)(in_RSI + 0xc);
  puVar7 = (undefined4 *)((long)pp_Var4 + 0xc);
  for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar7 = *puVar6;
    puVar6 = puVar6 + (ulong)bVar8 * -2 + 1;
    puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
  }
  *(undefined1 *)((long)pp_Var4 + 0x4c) = *(undefined1 *)(in_RSI + 0x4c);
  *(byte *)((long)pp_Var4 + 0x4d) = bVar1 & 1;
  (this->super_PubkeyProvider)._vptr_PubkeyProvider = pp_Var4;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return (__uniq_ptr_data<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>,_true,_true>
            )(__uniq_ptr_data<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<PubkeyProvider> Clone() const override
    {
        return std::make_unique<ConstPubkeyProvider>(m_expr_index, m_pubkey, m_xonly);
    }